

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc_hook_test.cc
# Opt level: O0

void MultithreadedTestThreadRunner(int thread_num)

{
  int local_3c;
  int local_38;
  int i;
  int shift;
  undefined1 local_20 [8];
  unique_lock<std::mutex> ml;
  int thread_num_local;
  
  ml._12_4_ = thread_num;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_20,&threadcount_lock);
  num_threads_remaining = num_threads_remaining + -1;
  std::condition_variable::wait<MultithreadedTestThreadRunner(int)::__0>
            ((condition_variable *)threadcount_ready,(unique_lock<std::mutex> *)local_20);
  std::condition_variable::notify_all();
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_20);
  local_38 = 0;
  for (local_3c = 7; local_3c != 0; local_3c = local_3c >> 1) {
    local_38 = local_38 + 1;
  }
  MultithreadedTestThread(&list,local_38,ml._12_4_);
  return;
}

Assistant:

void MultithreadedTestThreadRunner(int thread_num) {
  // Wait for all threads to start running.
  {
    std::unique_lock ml{threadcount_lock};

    assert(num_threads_remaining > 0);
    --num_threads_remaining;

    threadcount_ready.wait(ml, [&] () { return num_threads_remaining == 0; });
    // the last thread to decrement to 0 will wake everyone
    threadcount_ready.notify_all();
  }

  // shift is the smallest number such that (1<<shift) > kHookListMaxValues
  int shift = 0;
  for (int i = kHookListMaxValues; i > 0; i >>= 1) {
    shift += 1;
  }

  MultithreadedTestThread(&list, shift, thread_num);
}